

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O1

void __thiscall
MissingDependencyPrinter::OnMissingDep
          (MissingDependencyPrinter *this,Node *node,string *path,Rule *generator)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Missing dep: ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(node->path_)._M_dataplus._M_p,
                      (node->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," uses ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (generated by ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(generator->name_)._M_dataplus._M_p,(generator->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  return;
}

Assistant:

void MissingDependencyPrinter::OnMissingDep(Node* node, const std::string& path,
                                            const Rule& generator) {
  std::cout << "Missing dep: " << node->path() << " uses " << path
            << " (generated by " << generator.name() << ")\n";
}